

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantExist_rec(Gia_Man_t *p,int iObj,int *pRes)

{
  int iVar1;
  int iVar2;
  int c;
  int c_00;
  int iVar3;
  Gia_Obj_t *pObj_00;
  int fCompl [2];
  int pFans [2];
  int Lits1 [2];
  int Lits0 [2];
  Gia_Obj_t *pObj;
  int *pRes_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      iVar2 = Gia_ObjFaninId1(pObj_00,iObj);
      c = Gia_ObjFaninC0(pObj_00);
      c_00 = Gia_ObjFaninC1(pObj_00);
      iVar3 = Gia_ManQuantCheckSupp(p,iVar1,p->iSuppPi);
      if (iVar3 == 0) {
        Lits1[0] = Abc_Var2Lit(iVar1,0);
        Lits1[1] = Lits1[0];
      }
      else {
        Gia_ManQuantExist_rec(p,iVar1,Lits1);
      }
      iVar1 = Gia_ManQuantCheckSupp(p,iVar2,p->iSuppPi);
      if (iVar1 == 0) {
        pFans[0] = Abc_Var2Lit(iVar2,0);
        pFans[1] = pFans[0];
      }
      else {
        Gia_ManQuantExist_rec(p,iVar2,pFans);
      }
      iVar1 = Abc_LitNotCond(Lits1[0],c);
      iVar2 = Abc_LitNotCond(pFans[0],c_00);
      iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
      *pRes = iVar1;
      iVar1 = Abc_LitNotCond(Lits1[1],c);
      iVar2 = Abc_LitNotCond(pFans[1],c_00);
      iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
      pRes[1] = iVar1;
      Gia_ObjCopySetTwoArray(p,iObj,pRes);
    }
    else {
      *pRes = 0;
      pRes[1] = 1;
      Gia_ObjCopySetTwoArray(p,iObj,pRes);
    }
  }
  else {
    Gia_ObjCopyGetTwoArray(p,iObj,pRes);
  }
  return;
}

Assistant:

void Gia_ManQuantExist_rec( Gia_Man_t * p, int iObj, int pRes[2] )
{
    Gia_Obj_t * pObj;
    int Lits0[2], Lits1[2], pFans[2], fCompl[2];
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
    {
        Gia_ObjCopyGetTwoArray( p, iObj, pRes );
        return;
    }
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        pRes[0] = 0; pRes[1] = 1;
        Gia_ObjCopySetTwoArray( p, iObj, pRes );
        return;
    }
    pFans[0]  = Gia_ObjFaninId0( pObj, iObj );
    pFans[1]  = Gia_ObjFaninId1( pObj, iObj );
    fCompl[0] = Gia_ObjFaninC0( pObj );
    fCompl[1] = Gia_ObjFaninC1( pObj );
    if ( Gia_ManQuantCheckSupp(p, pFans[0], p->iSuppPi) )
        Gia_ManQuantExist_rec( p, pFans[0], Lits0 );
    else
        Lits0[0] = Lits0[1] = Abc_Var2Lit( pFans[0], 0 );
    if ( Gia_ManQuantCheckSupp(p, pFans[1], p->iSuppPi) )
        Gia_ManQuantExist_rec( p, pFans[1], Lits1 );
    else
        Lits1[0] = Lits1[1] = Abc_Var2Lit( pFans[1], 0 );
    pRes[0] = Gia_ManHashAnd( p, Abc_LitNotCond(Lits0[0], fCompl[0]), Abc_LitNotCond(Lits1[0], fCompl[1]) );
    pRes[1] = Gia_ManHashAnd( p, Abc_LitNotCond(Lits0[1], fCompl[0]), Abc_LitNotCond(Lits1[1], fCompl[1]) );
    Gia_ObjCopySetTwoArray( p, iObj, pRes );
}